

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

wchar_t player_check_terrain_damage(player *p,loc grid,_Bool actual)

{
  _Bool _Var1;
  uint32_t uVar2;
  undefined4 local_20;
  wchar_t base_dam;
  wchar_t dam_taken;
  _Bool actual_local;
  player *p_local;
  loc grid_local;
  
  local_20 = L'\0';
  _Var1 = square_isfiery((chunk *)cave,(loc_conflict)grid);
  if (_Var1) {
    uVar2 = Rand_div(100);
    local_20 = adjust_dam(p,L'\x02',uVar2 + L'e',actual);
    _Var1 = player_of_has(p,L'\v');
    if (_Var1) {
      equip_learn_flag(p,L'\v');
      local_20 = local_20 / 2;
      if (actual) {
        equip_learn_flag(p,L'\v');
      }
    }
  }
  return local_20;
}

Assistant:

int player_check_terrain_damage(struct player *p, struct loc grid, bool actual)
{
	int dam_taken = 0;

	if (square_isfiery(cave, grid)) {
		int base_dam = 100 + randint1(100);

		/* Fire damage */
		dam_taken = adjust_dam(p, ELEM_FIRE, base_dam, actual);

		/* Feather fall makes one lightfooted. */
		if (player_of_has(p, OF_FEATHER)) {
			equip_learn_flag(p, OF_FEATHER);
			dam_taken /= 2;
			if (actual) {
				equip_learn_flag(p, OF_FEATHER);
			}
		}
	}

	return dam_taken;
}